

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_set.cpp
# Opt level: O0

void __thiscall miniros::PollSet::createNativePollset(PollSet *this)

{
  bool bVar1;
  _Rb_tree_iterator<std::pair<const_int,_miniros::PollSet::SocketInfo>_> *this_00;
  pointer ppVar2;
  reference pvVar3;
  long in_RDI;
  socket_pollfd *pfd;
  SocketInfo *info;
  int i;
  iterator sock_end;
  iterator sock_it;
  scoped_lock<std::mutex> lock;
  map<int,_miniros::PollSet::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
  *in_stack_ffffffffffffff98;
  scoped_lock<std::mutex> *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffb8;
  SocketInfo *pSVar4;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar5;
  _Self local_38;
  _Self local_30 [3];
  undefined4 local_14;
  
  std::scoped_lock<std::mutex>::scoped_lock
            (in_stack_ffffffffffffffa0,(mutex_type *)in_stack_ffffffffffffff98);
  if ((*(byte *)(in_RDI + 0x58) & 1) == 0) {
    local_14 = 1;
  }
  else {
    this_00 = (_Rb_tree_iterator<std::pair<const_int,_miniros::PollSet::SocketInfo>_> *)
              (in_RDI + 0xa0);
    std::
    map<int,_miniros::PollSet::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
    ::size((map<int,_miniros::PollSet::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
            *)0x485841);
    std::vector<pollfd,_std::allocator<pollfd>_>::resize
              ((vector<pollfd,_std::allocator<pollfd>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    local_30[0]._M_node =
         (_Base_ptr)
         std::
         map<int,_miniros::PollSet::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
         ::begin(in_stack_ffffffffffffff98);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<int,_miniros::PollSet::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
         ::end(in_stack_ffffffffffffff98);
    iVar5 = 0;
    while( true ) {
      bVar1 = std::operator!=(local_30,&local_38);
      if (!bVar1) break;
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>::
               operator->((_Rb_tree_iterator<std::pair<const_int,_miniros::PollSet::SocketInfo>_> *)
                          0x485898);
      pSVar4 = &ppVar2->second;
      pvVar3 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[]
                         ((vector<pollfd,_std::allocator<pollfd>_> *)(in_RDI + 0xa0),(long)iVar5);
      pvVar3->fd = pSVar4->fd_;
      pvVar3->events = (short)pSVar4->events_;
      pvVar3->revents = 0;
      std::_Rb_tree_iterator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>::operator++
                (this_00);
      iVar5 = iVar5 + 1;
    }
    *(undefined1 *)(in_RDI + 0x58) = 0;
    local_14 = 0;
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x485939);
  return;
}

Assistant:

void PollSet::createNativePollset()
{
  std::scoped_lock<std::mutex> lock(socket_info_mutex_);

  if (!sockets_changed_)
  {
    return;
  }

  // Build the list of structures to pass to poll for the sockets we're servicing
  ufds_.resize(socket_info_.size());
  M_SocketInfo::iterator sock_it = socket_info_.begin();
  M_SocketInfo::iterator sock_end = socket_info_.end();
  for (int i = 0; sock_it != sock_end; ++sock_it, ++i)
  {
    const SocketInfo& info = sock_it->second;
    socket_pollfd& pfd = ufds_[i];
    pfd.fd = info.fd_;
    pfd.events = info.events_;
    pfd.revents = 0;
  }
  sockets_changed_ = false;
}